

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall
UtestShell::assertBitsEqual
          (UtestShell *this,unsigned_long expected,unsigned_long actual,unsigned_long mask,
          size_t byteCount,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString local_a8;
  TestFailure local_98;
  TestResult *pTVar2;
  
  pTVar2 = testResult_;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x29])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  (*pTVar2->_vptr_TestResult[10])();
  if (((actual ^ expected) & mask) != 0) {
    SimpleString::SimpleString(&local_a8,text);
    BitsEqualFailure::BitsEqualFailure
              ((BitsEqualFailure *)&local_98,this,fileName,lineNumber,expected,actual,mask,byteCount
               ,&local_a8);
    (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&local_a8);
  }
  return;
}

Assistant:

void UtestShell::assertBitsEqual(unsigned long expected, unsigned long actual, unsigned long mask, size_t byteCount, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if ((expected & mask) != (actual & mask))
        failWith(BitsEqualFailure(this, fileName, lineNumber, expected, actual, mask, byteCount, text), testTerminator);
}